

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_setop_node.cpp
# Opt level: O3

void duckdb::GatherSetOpBinders
               (BoundQueryNode *node,Binder *binder,
               vector<std::reference_wrapper<duckdb::Binder>,_true> *binders)

{
  pointer *pprVar1;
  QueryNodeType QVar2;
  iterator __position;
  BoundSetOperationNode *pBVar3;
  type node_00;
  type binder_00;
  reference_wrapper<duckdb::Binder> local_20;
  
  QVar2 = node->type;
  local_20._M_data = binder;
  while (QVar2 == SET_OPERATION_NODE) {
    pBVar3 = BoundQueryNode::Cast<duckdb::BoundSetOperationNode>(node);
    node_00 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator*(&pBVar3->left);
    binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar3->left_binder);
    GatherSetOpBinders(node_00,binder_00,binders);
    node = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator*(&pBVar3->right);
    local_20._M_data = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar3->right_binder);
    QVar2 = node->type;
  }
  __position._M_current =
       (binders->
       super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
       ).
       super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (binders->
      super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<std::reference_wrapper<duckdb::Binder>,std::allocator<std::reference_wrapper<duckdb::Binder>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::Binder>>
              ((vector<std::reference_wrapper<duckdb::Binder>,std::allocator<std::reference_wrapper<duckdb::Binder>>>
                *)binders,__position,&local_20);
  }
  else {
    (__position._M_current)->_M_data = local_20._M_data;
    pprVar1 = &(binders->
               super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return;
}

Assistant:

static void GatherSetOpBinders(BoundQueryNode &node, Binder &binder, vector<reference<Binder>> &binders) {
	if (node.type != QueryNodeType::SET_OPERATION_NODE) {
		binders.push_back(binder);
		return;
	}
	auto &setop_node = node.Cast<BoundSetOperationNode>();
	GatherSetOpBinders(*setop_node.left, *setop_node.left_binder, binders);
	GatherSetOpBinders(*setop_node.right, *setop_node.right_binder, binders);
}